

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosixSerialPort.cpp
# Opt level: O0

ssize_t __thiscall PosixSerialPort::read(PosixSerialPort *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  ssize_t sVar2;
  long lVar3;
  undefined4 in_register_00000034;
  fd_set *__arr;
  uint __i;
  int retval;
  int numread;
  timeval tv;
  fd_set fds;
  int len_local;
  uint8_t *buffer_local;
  PosixSerialPort *this_local;
  
  __i = 0;
  if (this->_devfd == -1) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    while ((int)__i < (int)__buf) {
      for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
        fds.fds_bits[(ulong)__arr._4_4_ - 1] = 0;
      }
      lVar3 = (long)(this->_devfd / 0x40);
      fds.fds_bits[lVar3 + -1] =
           1L << ((byte)((long)this->_devfd % 0x40) & 0x3f) | fds.fds_bits[lVar3 + -1];
      _retval = (long)(this->_timeout / 1000);
      tv.tv_sec = (__time_t)((this->_timeout % 1000) * 1000);
      iVar1 = select(this->_devfd + 1,(fd_set *)&tv.tv_usec,(fd_set *)0x0,(fd_set *)0x0,
                     (timeval *)&retval);
      if (iVar1 < 0) {
        this_local._4_4_ = 0xffffffff;
        goto LAB_0011d410;
      }
      if (iVar1 == 0) {
        this_local._4_4_ = __i;
        goto LAB_0011d410;
      }
      if ((fds.fds_bits[(long)(this->_devfd / 0x40) + -1] &
          1L << ((byte)((long)this->_devfd % 0x40) & 0x3f)) != 0) {
        sVar2 = ::read(this->_devfd,(void *)(CONCAT44(in_register_00000034,__fd) + (long)(int)__i),
                       (long)(int)((int)__buf - __i));
        if ((int)sVar2 < 0) {
          this_local._4_4_ = 0xffffffff;
          goto LAB_0011d410;
        }
        __i = (int)sVar2 + __i;
      }
    }
    this_local._4_4_ = __i;
  }
LAB_0011d410:
  return (ulong)this_local._4_4_;
}

Assistant:

int
PosixSerialPort::read(uint8_t* buffer, int len)
{
    fd_set fds;
    struct timeval tv;
    int numread = 0;
    int retval;

    if (_devfd == -1)
        return -1;

    while (numread < len)
    {
        FD_ZERO(&fds);
        FD_SET(_devfd, &fds);

        tv.tv_sec  = _timeout / 1000;
        tv.tv_usec = (_timeout % 1000) * 1000;

        retval = select(_devfd + 1, &fds, NULL, NULL, &tv);

        if (retval < 0)
        {
            return -1;
        }
        else if (retval == 0)
        {
            return numread;
        }
        else if (FD_ISSET(_devfd, &fds))
        {
            retval = ::read(_devfd, (uint8_t*) buffer + numread, len - numread);
            if (retval < 0)
                return -1;
            numread += retval;
        }
    }

    return numread;
}